

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringSaver.cpp
# Opt level: O3

StringRef __thiscall llvm::UniqueStringSaver::save(UniqueStringSaver *this,StringRef S)

{
  char *__src;
  char *__dest;
  size_t __n;
  StringRef SVar1;
  DenseSetEmpty Empty;
  DenseSetEmpty local_49;
  StringRef local_48;
  pair<llvm::DenseMapIterator<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>,_false>,_bool>
  local_38;
  
  local_48.Length = S.Length;
  local_48.Data = S.Data;
  DenseMapBase<llvm::DenseMap<llvm::StringRef,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llvm::StringRef>,llvm::detail::DenseSetPair<llvm::StringRef>>,llvm::StringRef,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<llvm::StringRef>,llvm::detail::DenseSetPair<llvm::StringRef>>
  ::try_emplace<llvm::detail::DenseSetEmpty&>(&local_38,this + 8,&local_48,&local_49);
  __n = local_48.Length;
  __src = local_48.Data;
  if (local_38.second == false) {
    __dest = ((local_38.first.Ptr)->key).Data;
    __n = ((local_38.first.Ptr)->key).Length;
  }
  else {
    __dest = (char *)BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                               (*(BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> **)
                                 this,local_48.Length + 1,1);
    memcpy(__dest,__src,__n);
    __dest[__n] = '\0';
    ((local_38.first.Ptr)->key).Data = __dest;
    ((local_38.first.Ptr)->key).Length = __n;
  }
  SVar1.Length = __n;
  SVar1.Data = __dest;
  return SVar1;
}

Assistant:

StringRef UniqueStringSaver::save(StringRef S) {
  auto R = Unique.insert(S);
  if (R.second)                 // cache miss, need to actually save the string
    *R.first = Strings.save(S); // safe replacement with equal value
  return *R.first;
}